

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O2

void __thiscall
glslang::TPoolAllocator::TPoolAllocator
          (TPoolAllocator *this,int growthIncrement,int allocationAlignment)

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  
  sVar2 = (size_t)growthIncrement;
  this->pageSize = sVar2;
  this->freeList = (tHeader *)0x0;
  this->inUseList = (tHeader *)0x0;
  (this->stack).
  super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).
  super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stack).
           super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stack).
           super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  if ((uint)growthIncrement < 0x1000) {
    this->pageSize = 0x1000;
    sVar2 = 0x1000;
  }
  this->currentPageOffset = sVar2;
  uVar3 = 8;
  if (7 < (uint)allocationAlignment) {
    uVar3 = allocationAlignment & 0xfffffff8;
  }
  uVar1 = 1;
  do {
    uVar4 = uVar1;
    uVar1 = uVar4 * 2;
  } while (uVar4 < (ulong)(long)(int)uVar3);
  this->alignment = uVar4;
  this->alignmentMask = uVar4 - 1;
  this->headerSkip = -uVar4 & uVar4 + 0x17;
  push(this);
  return;
}

Assistant:

TPoolAllocator::TPoolAllocator(int growthIncrement, int allocationAlignment) :
    pageSize(growthIncrement),
    alignment(allocationAlignment),
    freeList(nullptr),
    inUseList(nullptr),
    numCalls(0)
{
    //
    // Don't allow page sizes we know are smaller than all common
    // OS page sizes.
    //
    if (pageSize < 4*1024)
        pageSize = 4*1024;

    //
    // A large currentPageOffset indicates a new page needs to
    // be obtained to allocate memory.
    //
    currentPageOffset = pageSize;

    //
    // Adjust alignment to be at least pointer aligned and
    // power of 2.
    //
    size_t minAlign = sizeof(void*);
    alignment &= ~(minAlign - 1);
    if (alignment < minAlign)
        alignment = minAlign;
    size_t a = 1;
    while (a < alignment)
        a <<= 1;
    alignment = a;
    alignmentMask = a - 1;

    //
    // Align header skip
    //
    headerSkip = minAlign;
    if (headerSkip < sizeof(tHeader)) {
        headerSkip = (sizeof(tHeader) + alignmentMask) & ~alignmentMask;
    }

    push();
}